

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

bool __thiscall
spvtools::val::anon_unknown_0::hasDecoration
          (anon_unknown_0 *this,uint32_t id,Decoration decoration,ValidationState_t *vstate)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  Instruction *pIVar4;
  undefined4 in_register_00000014;
  uint32_t id_00;
  uint *puVar5;
  uint *puVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  id_00 = (uint32_t)this;
  local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = id_00;
  pmVar2 = std::
           map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
           ::operator[](&((ValidationState_t *)CONCAT44(in_register_00000014,decoration))->
                         id_decorations_,(key_type_conflict *)&local_40);
  for (p_Var3 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[1]._M_color == id) {
      return true;
    }
  }
  pIVar4 = ValidationState_t::FindDef
                     ((ValidationState_t *)CONCAT44(in_register_00000014,decoration),id_00);
  if ((pIVar4->inst_).opcode == 0x1e) {
    getStructMembers(&local_40,id_00,decoration,vstate);
    puVar6 = (uint *)CONCAT44(local_40.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint32_t)
                              local_40.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (puVar6 == local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      bVar1 = false;
    }
    else {
      do {
        puVar5 = puVar6 + 1;
        bVar1 = hasDecoration((anon_unknown_0 *)(ulong)*puVar6,id,decoration,vstate);
        if (bVar1) break;
        puVar6 = puVar5;
      } while (puVar5 != local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      puVar6 = (uint *)CONCAT44(local_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                local_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
    if (puVar6 != (uint *)0x0) {
      operator_delete(puVar6,(long)local_40.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6)
      ;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool hasDecoration(uint32_t id, spv::Decoration decoration,
                   ValidationState_t& vstate) {
  for (auto& dec : vstate.id_decorations(id)) {
    if (decoration == dec.dec_type()) return true;
  }
  if (spv::Op::OpTypeStruct != vstate.FindDef(id)->opcode()) {
    return false;
  }
  for (auto member_id : getStructMembers(id, spv::Op::OpTypeStruct, vstate)) {
    if (hasDecoration(member_id, decoration, vstate)) {
      return true;
    }
  }
  return false;
}